

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qssldiffiehellmanparameters.cpp
# Opt level: O3

QSslDiffieHellmanParameters __thiscall
QSslDiffieHellmanParameters::fromEncoded
          (QSslDiffieHellmanParameters *this,QIODevice *device,EncodingFormat encoding)

{
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QSslDiffieHellmanParameters(this);
      return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
    }
  }
  else {
    QIODevice::readAll();
    fromEncoded(this,&local_38,encoding);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSslDiffieHellmanParameters QSslDiffieHellmanParameters::fromEncoded(QIODevice *device, QSsl::EncodingFormat encoding)
{
    if (device)
        return fromEncoded(device->readAll(), encoding);
    else
        return QSslDiffieHellmanParameters();
}